

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void api_fixed_suite::fixed_first_unused_segment_const(void)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> expect;
  array<int,_4UL> array;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> local_40;
  undefined8 local_28;
  int aiStack_20 [4];
  
  local_28 = 0x160000000b;
  aiStack_20[0] = 0;
  aiStack_20[1] = 0;
  aiStack_20[2] = 0;
  aiStack_20[3] = 0;
  __l._M_len = 2;
  __l._M_array = aiStack_20 + 2;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l,&local_41);
  boost::detail::
  test_all_eq_impl<std::ostream,int_const*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x4c7,"void api_fixed_suite::fixed_first_unused_segment_const()",aiStack_20,
             aiStack_20 + 2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void fixed_first_unused_segment_const()
{
    std::array<int, 4> array = { 11, 22 };
    const circular_view<int, 4> span(array.begin(), array.end(), array.begin(), 2);
    auto segment = span.first_unused_segment();
    {
        std::vector<int> expect = { 0, 0 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
}